

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  byte bVar1;
  ushort uVar2;
  pointer paVar3;
  bool bVar4;
  uint __val;
  uint uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  long *plVar10;
  type_info *ptVar11;
  handle *phVar12;
  undefined8 *puVar13;
  function_record *pfVar14;
  PyMethodDef *pPVar15;
  object *poVar16;
  PyObject *pPVar17;
  handle hVar18;
  PyObject *pPVar19;
  error_already_set *this_00;
  ushort uVar20;
  PyBufferProcs *pPVar21;
  size_type *psVar22;
  ulong *puVar23;
  ulong uVar24;
  PyTypeObject *pPVar25;
  function_record *pfVar26;
  ulong uVar27;
  long lVar28;
  function_record *pfVar29;
  char cVar30;
  undefined8 uVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  pointer paVar32;
  uint __len;
  function_record *pfVar33;
  ulong __val_00;
  uint uVar34;
  undefined1 auVar35 [16];
  string signatures;
  capsule rec_capsule_2;
  object scope_module;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  function_record *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  cpp_function *local_118;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_110;
  function_record *local_108;
  type_info **local_100;
  strdup_guard local_f8;
  PyGetSetDef *local_e0;
  undefined1 local_d8 [24];
  object local_c0;
  str local_b8;
  undefined1 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar33 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar9 = "";
  if (pfVar33->name != (char *)0x0) {
    pcVar9 = pfVar33->name;
  }
  local_118 = this;
  local_108 = (function_record *)args;
  local_100 = types;
  pcVar9 = strdup_guard::operator()(&local_f8,pcVar9);
  pfVar33->name = pcVar9;
  if (pfVar33->doc != (char *)0x0) {
    pcVar9 = strdup_guard::operator()(&local_f8,pfVar33->doc);
    pfVar33->doc = pcVar9;
  }
  paVar32 = (pfVar33->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = *(pointer *)
            ((long)&(pfVar33->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  local_1a8 = pfVar33;
  local_e0 = (PyGetSetDef *)unique_rec;
  if (paVar32 != paVar3) {
    do {
      if (paVar32->name != (char *)0x0) {
        pcVar9 = strdup_guard::operator()(&local_f8,paVar32->name);
        paVar32->name = pcVar9;
      }
      if (paVar32->descr == (char *)0x0) {
        if ((paVar32->value).m_ptr != (PyObject *)0x0) {
          auVar35 = PyObject_Repr((paVar32->value).m_ptr);
          if ((PyTypeObject *)auVar35._0_8_ == (PyTypeObject *)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x28);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_1e8._0_8_ = auVar35._0_8_;
          cast<std::__cxx11::string>(&local_180,(pybind11 *)local_1e8,auVar35._8_8_);
          pcVar9 = strdup_guard::operator()(&local_f8,local_180._M_dataplus._M_p);
          paVar32->descr = pcVar9;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,
                            CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                     local_180.field_2._M_local_buf[0]) + 1);
          }
          object::~object((object *)local_1e8);
        }
      }
      else {
        pcVar9 = strdup_guard::operator()(&local_f8,paVar32->descr);
        paVar32->descr = pcVar9;
      }
      paVar32 = paVar32 + 1;
    } while (paVar32 != paVar3);
  }
  pfVar33 = local_1a8;
  pcVar9 = local_1a8->name;
  iVar7 = strcmp(pcVar9,"__init__");
  if (iVar7 == 0) {
    uVar20 = 1;
  }
  else {
    iVar7 = strcmp(pcVar9,"__setstate__");
    uVar20 = (ushort)(iVar7 == 0);
  }
  uVar2 = *(ushort *)&pfVar33->field_0x59;
  *(ushort *)&pfVar33->field_0x59 = uVar2 & 0xfffe | uVar20;
  if (((uVar2 & 2) == 0 & (byte)uVar20) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,(char *)(pfVar33->scope).m_ptr[1].ob_type,
               (allocator<char> *)local_1e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,pfVar33->name,(allocator<char> *)&local_1c8);
    uVar31 = _PyExc_FutureWarning;
    std::operator+(&local_160,"pybind11-bound class \'",&local_180);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_160);
    pPVar21 = (PyBufferProcs *)(plVar10 + 2);
    if ((PyBufferProcs *)*plVar10 == pPVar21) {
      local_128._0_8_ = pPVar21->bf_getbuffer;
      local_128._8_8_ = plVar10[3];
      local_138._0_8_ = (PyObject *)local_128;
    }
    else {
      local_128._0_8_ = pPVar21->bf_getbuffer;
      local_138._0_8_ = (PyObject *)*plVar10;
    }
    local_138._8_8_ = plVar10[1];
    *plVar10 = (long)pPVar21;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append(local_138,local_1e8._0_8_);
    psVar22 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar22) {
      local_1a0.field_2._M_allocated_capacity = *psVar22;
      local_1a0.field_2._8_8_ = plVar10[3];
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar22;
      local_1a0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1a0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar22;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    puVar23 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar23) {
      local_1c8.field_2._M_allocated_capacity = *puVar23;
      local_1c8.field_2._8_8_ = plVar10[3];
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *puVar23;
      local_1c8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1c8._M_string_length = plVar10[1];
    *plVar10 = (long)puVar23;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    PyErr_WarnEx(uVar31,local_1c8._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((PyObject *)local_138._0_8_ != (PyObject *)local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,
                      CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                               local_180.field_2._M_local_buf[0]) + 1);
    }
  }
  local_110 = &pfVar33->args;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  uVar27 = 0;
  lVar28 = 0;
  do {
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        hVar18.m_ptr = (PyObject *)local_100[lVar28];
        if ((PyTypeObject *)hVar18.m_ptr == (PyTypeObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1e8._0_8_ = hVar18.m_ptr;
        ptVar11 = detail::get_type_info((type_index *)local_1e8,false);
        lVar28 = lVar28 + 1;
        if (ptVar11 == (type_info *)0x0) {
          if ((uVar27 == 0 & (byte)local_1a8->field_0x59 >> 1) != 1) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_1e8,
                       (char *)((long)&((hVar18.m_ptr)->ob_type->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)((hVar18.m_ptr)->ob_type->ob_base).ob_base.ob_refcnt ==
                                      '*')),(allocator<char> *)&local_1c8);
            detail::clean_type_id((string *)local_1e8);
            std::__cxx11::string::_M_append((char *)&local_180,local_1e8._0_8_);
            if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
            }
            goto LAB_0010d9c4;
          }
          local_138._8_8_ = (local_1a8->scope).m_ptr;
          local_128._0_8_ = "__module__";
          local_128._8_8_ = (PyObject *)0x0;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1a0,phVar12);
          puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          puVar23 = puVar13 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar13 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_1c8.field_2._M_allocated_capacity = *puVar23;
            local_1c8.field_2._8_8_ = puVar13[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar23;
            local_1c8._M_dataplus._M_p = (pointer)*puVar13;
          }
          local_1c8._M_string_length = puVar13[1];
          *puVar13 = puVar23;
          puVar13[1] = 0;
          *(undefined1 *)(puVar13 + 2) = 0;
          local_d8._8_8_ = (local_1a8->scope).m_ptr;
          local_d8._16_8_ = "__qualname__";
          local_c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_d8)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_160,phVar12);
          uVar31 = (ternaryfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            uVar31 = local_1c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < (ternaryfunc)(local_160._M_string_length + local_1c8._M_string_length)
             ) {
            uVar31 = (ternaryfunc)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              uVar31 = local_160.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar31 <
                (ternaryfunc)(local_160._M_string_length + local_1c8._M_string_length))
            goto LAB_0010d7ca;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_160,0,(char *)0x0,
                                         (ulong)local_1c8._M_dataplus._M_p);
          }
          else {
LAB_0010d7ca:
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1c8,(ulong)local_160._M_dataplus._M_p);
          }
          local_1e8._0_8_ = local_1d8;
          pPVar25 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar25) {
            local_1d8._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_1d8._8_8_ = plVar10[3];
          }
          else {
            local_1d8._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_1e8._0_8_ = (PyObject *)*plVar10;
          }
          local_1e8._8_8_ = plVar10[1];
          *plVar10 = (long)pPVar25;
          plVar10[1] = 0;
          *(undefined1 *)&(pPVar25->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_180,local_1e8._0_8_);
        }
        else {
          pPVar25 = ptVar11->type;
          local_128._0_8_ = "__module__";
          local_128._8_8_ = (PyObject *)0x0;
          local_138._8_8_ = pPVar25;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1a0,phVar12);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          puVar23 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_1c8.field_2._M_allocated_capacity = *puVar23;
            local_1c8.field_2._8_8_ = plVar10[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar23;
            local_1c8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_1c8._M_string_length = plVar10[1];
          *plVar10 = (long)puVar23;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          local_d8._16_8_ = "__qualname__";
          local_c0.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_d8._8_8_ = pPVar25;
          phVar12 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_d8)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_160,phVar12);
          uVar31 = (ternaryfunc)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            uVar31 = local_1c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar31 < (ternaryfunc)(local_160._M_string_length + local_1c8._M_string_length)
             ) {
            uVar31 = (ternaryfunc)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              uVar31 = local_160.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar31 <
                (ternaryfunc)(local_160._M_string_length + local_1c8._M_string_length))
            goto LAB_0010d62b;
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_160,0,(char *)0x0,
                                         (ulong)local_1c8._M_dataplus._M_p);
          }
          else {
LAB_0010d62b:
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1c8,(ulong)local_160._M_dataplus._M_p);
          }
          local_1e8._0_8_ = local_1d8;
          pPVar25 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar25) {
            local_1d8._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_1d8._8_8_ = plVar10[3];
          }
          else {
            local_1d8._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_1e8._0_8_ = (PyObject *)*plVar10;
          }
          local_1e8._8_8_ = plVar10[1];
          *plVar10 = (long)pPVar25;
          plVar10[1] = 0;
          *(undefined1 *)&(pPVar25->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_180,local_1e8._0_8_);
        }
        if ((PyObject *)local_1e8._0_8_ != (PyObject *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        object::~object(&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        object::~object((object *)(local_128 + 8));
      }
      else {
        if (bVar1 == 0) break;
LAB_0010d4d3:
        std::__cxx11::string::push_back((char)&local_180);
      }
    }
    else if (bVar1 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        if ((function_record *)(local_1a8->nargs_kw_only + uVar27) == local_108 &&
            local_1a8->nargs_kw_only != 0) {
          std::__cxx11::string::append((char *)&local_180);
        }
        paVar32 = (local_1a8->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((uVar27 < (ulong)((long)(local_1a8->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar32 >> 5
                              )) && (paVar32[uVar27].name != (char *)0x0)) ||
           ((uVar27 == 0 && ((local_1a8->field_0x59 & 0x10) != 0)))) {
          std::__cxx11::string::append((char *)&local_180);
        }
        else {
          __val_00 = uVar27 - ((*(ushort *)&local_1a8->field_0x59 >> 4 & 1) != 0);
          cVar30 = '\x01';
          if (9 < __val_00) {
            uVar24 = __val_00;
            cVar6 = '\x04';
            do {
              cVar30 = cVar6;
              if (uVar24 < 100) {
                cVar30 = cVar30 + -2;
                goto LAB_0010d8e4;
              }
              if (uVar24 < 1000) {
                cVar30 = cVar30 + -1;
                goto LAB_0010d8e4;
              }
              if (uVar24 < 10000) goto LAB_0010d8e4;
              bVar4 = 99999 < uVar24;
              uVar24 = uVar24 / 10000;
              cVar6 = cVar30 + '\x04';
            } while (bVar4);
            cVar30 = cVar30 + '\x01';
          }
LAB_0010d8e4:
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar30);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1c8._M_dataplus._M_p,(uint)local_1c8._M_string_length,__val_00);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x13c80f);
          local_1e8._0_8_ = local_1d8;
          pPVar25 = (PyTypeObject *)(plVar10 + 2);
          if ((PyTypeObject *)*plVar10 == pPVar25) {
            local_1d8._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_1d8._8_8_ = plVar10[3];
          }
          else {
            local_1d8._0_8_ = (pPVar25->ob_base).ob_base.ob_refcnt;
            local_1e8._0_8_ = (PyObject *)*plVar10;
          }
          local_1e8._8_8_ = plVar10[1];
          *plVar10 = (long)pPVar25;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_180,local_1e8._0_8_);
          if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_180);
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0010d4d3;
      paVar32 = (local_1a8->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar27 < (ulong)((long)(local_1a8->args).
                                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar32 >> 5))
         && (paVar32[uVar27].descr != (char *)0x0)) {
        std::__cxx11::string::append((char *)&local_180);
        std::__cxx11::string::append((char *)&local_180);
      }
      uVar27 = uVar27 + 1;
      if (uVar27 == local_1a8->nargs_pos_only && local_1a8->nargs_pos_only != 0) {
        std::__cxx11::string::append((char *)&local_180);
      }
    }
LAB_0010d9c4:
    text = (char *)((byte *)text + 1);
  } while( true );
  if (((function_record *)uVar27 != local_108) || (local_100[lVar28] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar9 = strdup_guard::operator()(&local_f8,local_180._M_dataplus._M_p);
  pfVar33 = local_1a8;
  local_1a8->signature = pcVar9;
  if ((local_1a8->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_1a8->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_110);
  }
  pfVar33->nargs = (uint16_t)local_108;
  pPVar17 = (pfVar33->sibling).m_ptr;
  if ((pPVar17 != (PyObject *)0x0) && (pPVar17->ob_type == (PyTypeObject *)&PyInstanceMethod_Type))
  {
    (pfVar33->sibling).m_ptr = (PyObject *)pPVar17[1].ob_refcnt;
  }
  pPVar17 = (pfVar33->sibling).m_ptr;
  if (pPVar17 == (PyObject *)0x0) {
LAB_0010dacc:
    pfVar29 = (function_record *)0x0;
  }
  else {
    pPVar25 = pPVar17->ob_type;
    if ((pPVar25 != (PyTypeObject *)&PyCFunction_Type) &&
       (iVar7 = PyType_IsSubtype(pPVar25,&PyCFunction_Type), iVar7 == 0)) {
      if (((pfVar33->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*pfVar33->name != '_')) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a0,pfVar33->name,(allocator<char> *)local_138);
        std::operator+(&local_1c8,"Cannot overload existing non-function object \"",&local_1a0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_1c8);
        local_1e8._0_8_ = *plVar10;
        pPVar17 = (PyObject *)(plVar10 + 2);
        if ((PyObject *)local_1e8._0_8_ == pPVar17) {
          local_1d8._0_8_ = pPVar17->ob_refcnt;
          local_1d8._8_8_ = plVar10[3];
          local_1e8._0_8_ = (PyObject *)local_1d8;
        }
        else {
          local_1d8._0_8_ = pPVar17->ob_refcnt;
        }
        local_1e8._8_8_ = plVar10[1];
        *plVar10 = (long)pPVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        pybind11_fail((string *)local_1e8);
      }
      goto LAB_0010dacc;
    }
    pPVar17 = (pfVar33->sibling).m_ptr;
    if ((*(byte *)(pPVar17[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_1e8._0_8_ = pPVar17[1].ob_type;
    }
    else {
      local_1e8._0_8_ = (PyTypeObject *)0x0;
    }
    if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)0x0) {
      (((PyVarObject *)&((PyObject *)local_1e8._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
           (((PyVarObject *)&((PyObject *)local_1e8._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
    }
    pfVar14 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_1e8);
    pfVar29 = (function_record *)0x0;
    if ((pfVar14->scope).m_ptr == (pfVar33->scope).m_ptr) {
      pfVar29 = pfVar14;
    }
    object::~object((object *)local_1e8);
  }
  if (pfVar29 == (function_record *)0x0) {
    pPVar15 = (PyMethodDef *)operator_new(0x20);
    *(undefined8 *)&pPVar15->ml_flags = 0;
    pPVar15->ml_doc = (char *)0x0;
    pPVar15->ml_name = (char *)0x0;
    pPVar15->ml_meth = (PyCFunction)0x0;
    pfVar33->def = pPVar15;
    *(undefined8 *)&pPVar15->ml_flags = 0;
    pPVar15->ml_doc = (char *)0x0;
    pPVar15->ml_name = (char *)0x0;
    pPVar15->ml_meth = (PyCFunction)0x0;
    pPVar15 = pfVar33->def;
    pPVar15->ml_name = pfVar33->name;
    pPVar15->ml_meth = dispatcher;
    pPVar15->ml_flags = 3;
    pfVar14 = (((__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                 *)&local_e0->name)->
              super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              )._M_t.
              super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
    (((__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
       *)&local_e0->name)->
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    )._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         (function_record *)0x0;
    capsule::capsule((capsule *)&local_1c8,pfVar14,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    if (local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_1a0._M_dataplus._M_p = (pointer)0x0;
    pPVar17 = (pfVar33->scope).m_ptr;
    if (pPVar17 != (PyObject *)0x0) {
      iVar7 = PyObject_HasAttrString(pPVar17,"__module__");
      if (iVar7 == 1) {
        local_1e8._8_8_ = (pfVar33->scope).m_ptr;
        local_1d8._0_8_ = "__module__";
        local_1d8._8_8_ = 0;
        poVar16 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1e8);
      }
      else {
        iVar7 = PyObject_HasAttrString((pfVar33->scope).m_ptr,"__name__");
        if (iVar7 != 1) goto LAB_0010dcf1;
        local_1e8._8_8_ = (pfVar33->scope).m_ptr;
        local_1d8._0_8_ = "__name__";
        local_1d8._8_8_ = 0;
        poVar16 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1e8);
      }
      local_138._0_8_ = (poVar16->super_handle).m_ptr;
      if ((PyBufferProcs *)local_138._0_8_ != (PyBufferProcs *)0x0) {
        ((PyObject *)local_138._0_8_)->ob_refcnt =
             (Py_ssize_t)((getbufferproc)((PyObject *)local_138._0_8_)->ob_refcnt + 1);
      }
      object::operator=((object *)&local_1a0,(object *)local_138);
      object::~object((object *)local_138);
      object::~object((object *)(local_1d8 + 8));
    }
LAB_0010dcf1:
    pPVar17 = (PyObject *)
              PyCMethod_New(pfVar33->def,local_1c8._M_dataplus._M_p,local_1a0._M_dataplus._M_p,0);
    (local_118->super_function).super_object.super_handle.m_ptr = pPVar17;
    if (pPVar17 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    object::~object((object *)&local_1a0);
    this_01 = &local_1c8;
  }
  else {
    pPVar17 = (pfVar33->sibling).m_ptr;
    (local_118->super_function).super_object.super_handle.m_ptr = pPVar17;
    if (pPVar17 != (PyObject *)0x0) {
      pPVar17->ob_refcnt = pPVar17->ob_refcnt + 1;
    }
    uVar20 = *(ushort *)&pfVar33->field_0x59;
    if (((*(ushort *)&pfVar29->field_0x59 ^ uVar20) & 0x10) != 0) {
      iVar7 = 0x13cdd2;
      if ((uVar20 & 0x10) == 0) {
        iVar7 = 0x13c988;
      }
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,iVar7,((uVar20 & 0x10) >> 3) + iVar7 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0)
      ;
      plVar10 = (long *)std::__cxx11::string::append(local_d8);
      local_160._M_dataplus._M_p = (pointer)*plVar10;
      psVar22 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_160._M_dataplus._M_p == psVar22) {
        local_160.field_2._M_allocated_capacity = *psVar22;
        local_160.field_2._8_8_ = plVar10[3];
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      }
      else {
        local_160.field_2._M_allocated_capacity = *psVar22;
      }
      local_160._M_string_length = plVar10[1];
      *plVar10 = (long)psVar22;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      local_50.obj.m_ptr = (local_1a8->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_b8,&local_50);
      str::operator_cast_to_string(&local_70,&local_b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     &local_160,&local_70);
      plVar10 = (long *)std::__cxx11::string::append(local_138);
      local_1a0._M_dataplus._M_p = (pointer)*plVar10;
      psVar22 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_1a0._M_dataplus._M_p == psVar22) {
        local_1a0.field_2._M_allocated_capacity = *psVar22;
        local_1a0.field_2._8_8_ = plVar10[3];
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar22;
      }
      local_1a0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar22;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_1a8->name,&local_139);
      std::operator+(&local_1c8,&local_1a0,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     &local_1c8,&local_180);
      pybind11_fail((string *)local_1e8);
    }
    pfVar14 = pfVar29;
    if ((uVar20 >> 8 & 1) == 0) {
      do {
        pfVar26 = pfVar14;
        pfVar14 = pfVar26->next;
      } while (pfVar14 != (function_record *)0x0);
      pfVar14 = (((__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                   *)&local_e0->name)->
                super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                )._M_t.
                super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      (((__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
         *)&local_e0->name)->
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      )._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           (function_record *)0x0;
      pfVar26->next = pfVar14;
      pfVar14 = pfVar29;
      if (local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      goto LAB_0010dd31;
    }
    pfVar33->next = pfVar29;
    local_1e8._0_8_ = pPVar17[1].ob_type;
    if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)0x0) {
      (((PyVarObject *)&((PyObject *)local_1e8._0_8_)->ob_refcnt)->ob_base).ob_refcnt =
           (((PyVarObject *)&((PyObject *)local_1e8._0_8_)->ob_refcnt)->ob_base).ob_refcnt + 1;
    }
    pfVar14 = (((__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                 *)&local_e0->name)->
              super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              )._M_t.
              super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
              .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
    (((__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
       *)&local_e0->name)->
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    )._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         (function_record *)0x0;
    iVar7 = PyCapsule_SetPointer(local_1e8._0_8_,pfVar14);
    if (iVar7 != 0) {
      pybind11_fail("Could not set capsule pointer");
    }
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
    if (local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
    }
  }
  object::~object((object *)this_01);
  pfVar14 = pfVar33;
LAB_0010dd31:
  hVar18.m_ptr = (PyObject *)local_1d8;
  local_1e8._8_8_ = (PyObject *)0x0;
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
  local_1e8._0_8_ = hVar18.m_ptr;
  if ((pfVar29 != (function_record *)0x0) && (DAT_001466d1 == '\x01')) {
    std::__cxx11::string::append(local_1e8);
    std::__cxx11::string::append(local_1e8);
    hVar18.m_ptr = (PyObject *)std::__cxx11::string::append(local_1e8);
  }
  iVar7 = 0;
  local_110 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               *)CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)hVar18.m_ptr >> 8),1));
  local_108 = pfVar29;
  do {
    if (DAT_001466d1 == '\x01') {
      if (0 < iVar7) {
        std::__cxx11::string::append(local_1e8);
      }
      if (pfVar29 != (function_record *)0x0) {
        uVar34 = iVar7 + 1;
        local_100 = (type_info **)CONCAT44(local_100._4_4_,uVar34);
        __val = -uVar34;
        if (0 < (int)uVar34) {
          __val = uVar34;
        }
        __len = 1;
        if (9 < __val) {
          uVar27 = (ulong)__val;
          uVar5 = 4;
          do {
            __len = uVar5;
            uVar8 = (uint)uVar27;
            if (uVar8 < 100) {
              __len = __len - 2;
              goto LAB_0010de29;
            }
            if (uVar8 < 1000) {
              __len = __len - 1;
              goto LAB_0010de29;
            }
            if (uVar8 < 10000) goto LAB_0010de29;
            uVar27 = uVar27 / 10000;
            uVar5 = __len + 4;
          } while (99999 < uVar8);
          __len = __len + 1;
        }
LAB_0010de29:
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_1a0,(char)__len - (char)((int)uVar34 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1a0._M_dataplus._M_p + (uVar34 >> 0x1f),__len,__val);
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
        pfVar33 = local_1a8;
        puVar23 = puVar13 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar23) {
          local_1c8.field_2._M_allocated_capacity = *puVar23;
          local_1c8.field_2._8_8_ = puVar13[3];
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *puVar23;
          local_1c8._M_dataplus._M_p = (pointer)*puVar13;
        }
        local_1c8._M_string_length = puVar13[1];
        *puVar13 = puVar23;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::__cxx11::string::_M_append(local_1e8,(ulong)local_1c8._M_dataplus._M_p);
        iVar7 = (int)local_100;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        pfVar29 = local_108;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append(local_1e8);
      std::__cxx11::string::append(local_1e8);
      std::__cxx11::string::append(local_1e8);
    }
    if (((pfVar14->doc != (char *)0x0) && (*pfVar14->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (DAT_001466d1 == '\0') {
        if (((ulong)local_110 & 1) == 0) {
          std::__cxx11::string::append(local_1e8);
        }
        else {
          local_110 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)((ulong)local_110 & 0xffffffff00000000);
        }
      }
      if (DAT_001466d1 == '\x01') {
        std::__cxx11::string::append(local_1e8);
      }
      std::__cxx11::string::append(local_1e8);
      if (DAT_001466d1 == '\x01') {
        std::__cxx11::string::append(local_1e8);
      }
    }
    pfVar14 = pfVar14->next;
    if (pfVar14 == (function_record *)0x0) {
      pPVar17 = (local_118->super_function).super_object.super_handle.m_ptr;
      free(*(void **)(pPVar17[1].ob_refcnt + 0x18));
      if ((PyObject *)local_1e8._8_8_ == (PyObject *)0x0) {
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar9 = strdup((char *)local_1e8._0_8_);
      }
      *(char **)(pPVar17[1].ob_refcnt + 0x18) = pcVar9;
      if ((pfVar33->field_0x59 & 0x10) != 0) {
        pPVar19 = (PyObject *)
                  PyInstanceMethod_New((local_118->super_function).super_object.super_handle.m_ptr);
        (local_118->super_function).super_object.super_handle.m_ptr = pPVar19;
        if (pPVar19 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar17->ob_refcnt = pPVar17->ob_refcnt + -1;
        if (pPVar17->ob_refcnt == 0) {
          _Py_Dealloc(pPVar17);
        }
      }
      if ((PyObject *)local_1e8._0_8_ != (PyObject *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,
                        CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                                 local_180.field_2._M_local_buf[0]) + 1);
      }
      strdup_guard::~strdup_guard(&local_f8);
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec, const char *text,
                            const std::type_info *const *types, size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destuct the pointer. `initialize` (the caller) still relies on the
        // pointee being alive after this call. Only move out if a `capsule` is going to keep it alive.
        auto rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the strings
        // are only referenced before strdup'ing. So only *after* the following block could `destruct`
        // safely be called, but even then, `repr` could still throw in the middle of copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = guarded_strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = guarded_strdup(a.name);
            if (a.descr)
                a.descr = guarded_strdup(a.descr);
            else if (a.value)
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;
                // Separator for keyword-only arguments, placed before the kw
                // arguments start
                if (rec->nargs_kw_only > 0 && arg_index + rec->nargs_kw_only == args)
                    signature += "*, ";
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only)
                    signature += ", /";
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = guarded_strdup("__nonzero__");
        }
#endif
        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(), [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next)
                    chain = chain->next;
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc = signatures.empty() ? nullptr : strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }